

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

wchar_t Term_get_first_tile_row(term *t)

{
  long lVar1;
  long lVar2;
  
  if (angband_term[0] == t) {
    return row_top_map[Term->sidebar_mode];
  }
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 == 0x1c) {
      return L'\x01';
    }
    lVar1 = lVar2 + 4;
  } while (*(term **)((long)angband_term + lVar2 * 2 + 8) != t);
  return (uint)((*(byte *)((long)window_flag + lVar2 + 4) & 0x80) == 0);
}

Assistant:

int Term_get_first_tile_row(term *t)
{
	int result;

	if (t == angband_term[0]) {
		/*
		 * In the main window, there's no tiles in the top bar, does
		 * not account for the case where the main window is used as
		 * the target for display_map() or displays tiles in the
		 * knowledge menus.
		 */
		result = ROW_MAP;
	} else {
		/* In other windows, have to check the flags. */
		int i = 1;

		while (1) {
			if (i >= ANGBAND_TERM_MAX) {
				/*
				 * Don't know the flags.  Err on the side of
				 * drawing too few tiles.
				 */
				result = 1;
				break;
			}
			if (t == angband_term[i]) {
				if (window_flag[i] & PW_OVERHEAD) {
					/*
					 * All rows are valid targets for
					 * tiles.
					 */
					result = 0;
				} else {
					/*
					 * It's presumably a minimap view where
					 * the first row has a non-tile border.
					 */
					result = 1;
				}
				break;
			}
			++i;
		}
	}
	return result;
}